

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> __thiscall
duckdb::ReservoirSamplePercentage::GetChunk(ReservoirSamplePercentage *this)

{
  vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
  *this_00;
  reference this_01;
  pointer pRVar1;
  pointer pDVar2;
  long *in_RSI;
  
  if ((char)in_RSI[0xb] == '\0') {
    (**(code **)(*in_RSI + 0x20))();
  }
  this_00 = (vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
             *)(in_RSI + 7);
  while( true ) {
    if (in_RSI[7] == in_RSI[8]) {
      (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)0x0;
      return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
             (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)this;
    }
    this_01 = vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_true>
              ::front((vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_true>
                       *)this_00);
    pRVar1 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
             ::operator->(this_01);
    (*(pRVar1->super_BlockingSample)._vptr_BlockingSample[6])(this,pRVar1);
    if (((this->super_BlockingSample)._vptr_BlockingSample != (_func_int **)0x0) &&
       (pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)this), pDVar2->count != 0)) break;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
    ::erase(this_00,(this_00->
                    super__Vector_base<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
    ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)this);
  }
  return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
         (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)this;
}

Assistant:

unique_ptr<DataChunk> ReservoirSamplePercentage::GetChunk() {
	// reservoir sample percentage should never stay
	if (!is_finalized) {
		Finalize();
	}
	while (!finished_samples.empty()) {
		auto &front = finished_samples.front();
		auto chunk = front->GetChunk();
		if (chunk && chunk->size() > 0) {
			return chunk;
		}
		// move to the next sample
		finished_samples.erase(finished_samples.begin());
	}
	return nullptr;
}